

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          int *primNums,int nPrimitives,int depth,
          unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges,int *prims0,
          int *prims1,int badRefines)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  pointer pBVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  KdAccelNode *__src;
  pointer pBVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  int otherAxis0;
  int iVar16;
  KdAccelNode *pKVar17;
  Point3<float> *pPVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  EdgeType *pEVar23;
  ulong uVar24;
  ulong uVar25;
  BoundEdge *__i;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  BoundEdge *pBVar32;
  Bounds3f *pBVar33;
  int otherAxis1;
  int iVar34;
  BoundEdge *pBVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  undefined1 in_ZMM8 [64];
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 in_XMM20 [16];
  ulong local_140;
  Bounds3f bounds1;
  Bounds3f bounds0;
  
  bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)nodeNum;
  bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)this->nextFreeNode;
  if (this->nextFreeNode != nodeNum) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp"
               ,0x363,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [8])"nodeNum",
               (char (*) [13])"nextFreeNode",(char (*) [8])"nodeNum",(int *)&bounds0,
               (char (*) [13])"nextFreeNode",(int *)&bounds1);
  }
  iVar20 = nodeNum;
  if (this->nAllocedNodes == nodeNum) {
    uVar24 = 0x200;
    if (0x200 < nodeNum * 2) {
      uVar24 = (ulong)(uint)(nodeNum * 2);
    }
    pKVar17 = (KdAccelNode *)operator_new__(uVar24 * 8);
    if (0 < nodeNum) {
      __src = this->nodes;
      memcpy(pKVar17,__src,(ulong)(uint)nodeNum << 3);
      if (__src != (KdAccelNode *)0x0) {
        operator_delete__(__src);
        iVar20 = this->nextFreeNode;
      }
    }
    this->nodes = pKVar17;
    this->nAllocedNodes = (int)uVar24;
  }
  this->nextFreeNode = iVar20 + 1;
  if ((depth != 0) && (this->maxPrims < nPrimitives)) {
    uVar15 = nPrimitives * 2;
    pfVar1 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    fVar11 = (float)nPrimitives * (float)this->isectCost;
    uVar6 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    uVar8 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    auVar43._4_4_ = uVar8;
    auVar43._0_4_ = uVar6;
    auVar43._8_8_ = 0;
    fVar12 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.x -
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    uVar7 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    uVar9 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    auVar41._4_4_ = uVar9;
    auVar41._0_4_ = uVar7;
    auVar41._8_8_ = 0;
    auVar43 = vsubps_avx(auVar41,auVar43);
    auVar45 = ZEXT416((uint)fVar12);
    pfVar2 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    auVar41 = vmovshdup_avx(auVar43);
    uVar24 = vcmpps_avx512vl(auVar43,auVar45,1);
    pfVar3 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    fVar46 = auVar41._0_4_;
    fVar42 = auVar43._0_4_;
    pfVar4 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    uVar22 = vcmpps_avx512vl(auVar41,ZEXT416((uint)fVar12),1);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar46)),auVar43,ZEXT416((uint)fVar12));
    uVar25 = (ulong)((fVar42 <= fVar46) + 1);
    if ((uVar24 & uVar22 & 1) != 0) {
      uVar25 = 0;
    }
    lVar21 = (long)(int)uVar15;
    auVar14 = vfmadd231ss_fma(auVar14,auVar43,auVar41);
    iVar20 = 0;
    uVar24 = 1;
    if (1 < (int)uVar15) {
      uVar24 = (ulong)uVar15;
    }
    local_140 = 0xffffffff;
    do {
      iVar31 = (int)uVar25;
      if (nPrimitives < 1) {
        pBVar35 = edges[uVar25]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
      }
      else {
        uVar22 = 0;
        pBVar10 = (allPrimBounds->
                  super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar19 = primNums[uVar22];
          pBVar5 = pBVar10 + iVar19;
          if (iVar31 == 1) {
            fVar40 = (pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.y;
            pBVar35 = edges[uVar25]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            pBVar32 = pBVar35 + uVar22 * 2;
            lVar29 = 0x10;
          }
          else if (iVar31 == 0) {
            fVar40 = (pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.x;
            pBVar35 = edges[uVar25]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            pBVar32 = pBVar35 + uVar22 * 2;
            lVar29 = 0xc;
          }
          else {
            fVar40 = (pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.z;
            pBVar35 = edges[uVar25]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            pBVar32 = pBVar35 + uVar22 * 2;
            lVar29 = 0x14;
          }
          pBVar32->t = fVar40;
          pBVar32->primNum = iVar19;
          pBVar32->type = Start;
          uVar26 = (int)uVar22 * 2 | 1;
          uVar22 = uVar22 + 1;
          pBVar35[uVar26].t =
               *(Float *)((long)&(pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.x + lVar29);
          pBVar35[uVar26].primNum = iVar19;
          pBVar35[uVar26].type = End;
        } while (uVar22 != (uint)nPrimitives);
      }
      uVar26 = 0xffffffff;
      if (nPrimitives == 0) {
        iVar19 = 0;
        bVar36 = true;
      }
      else {
        std::
        __introsort_loop<pbrt::BoundEdge*,long,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar35,pBVar35 + lVar21,(int)LZCOUNT(lVar21) * 2 ^ 0x7e);
        if (nPrimitives < 9) {
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    (pBVar35,pBVar35 + lVar21);
        }
        else {
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    (pBVar35,pBVar35 + 0x10);
          lVar29 = lVar21 * 0xc + -0xc0;
          do {
            std::
            __unguarded_linear_insert<pbrt::BoundEdge*,__gnu_cxx::__ops::_Val_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                      ();
            lVar29 = lVar29 + -0xc;
          } while (lVar29 != 0);
        }
        if (nPrimitives < 1) {
          bVar36 = false;
          iVar19 = 0;
          uVar26 = 0xffffffff;
        }
        else {
          uVar22 = 0xffffffff;
          uVar27 = 0;
          iVar34 = iVar31 + 2 + ((iVar31 + 2U) / 3) * -3;
          iVar16 = iVar31 + 1 + ((iVar31 + 1U) / 3) * -3;
          pEVar23 = &(edges[uVar25]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl)->type;
          auVar37 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)this->emptyBonus));
          auVar44._0_4_ = (float)this->traversalCost;
          auVar44._4_12_ = in_ZMM8._4_12_;
          iVar19 = 0;
          iVar28 = nPrimitives;
          do {
            pBVar33 = nodeBounds;
            if ((iVar31 != 0) && (pBVar33 = (Bounds3f *)pfVar2, iVar31 != 1)) {
              pBVar33 = (Bounds3f *)pfVar4;
            }
            fVar40 = ((BoundEdge *)(pEVar23 + -2))->t;
            iVar28 = iVar28 - (uint)(*pEVar23 == End);
            if ((pBVar33->pMin).super_Tuple3<pbrt::Point3,_float>.x < fVar40) {
              pPVar18 = &nodeBounds->pMax;
              if ((iVar31 != 0) && (pPVar18 = (Point3<float> *)pfVar1, iVar31 != 1)) {
                pPVar18 = (Point3<float> *)pfVar3;
              }
              if (fVar40 < (pPVar18->super_Tuple3<pbrt::Point3,_float>).x) {
                auVar47 = auVar45;
                if ((iVar16 != 0) && (auVar47 = auVar43, iVar16 != 1)) {
                  auVar47 = auVar41;
                }
                auVar39 = auVar45;
                if ((iVar34 != 0) && (auVar39 = auVar43, iVar34 != 1)) {
                  auVar39 = auVar41;
                }
                pBVar33 = nodeBounds;
                if ((iVar31 != 0) && (pBVar33 = (Bounds3f *)pfVar2, iVar31 != 1)) {
                  pBVar33 = (Bounds3f *)pfVar4;
                }
                fVar48 = fVar12;
                if ((iVar16 != 0) && (fVar48 = fVar42, iVar16 != 1)) {
                  fVar48 = fVar46;
                }
                fVar49 = fVar12;
                if ((iVar34 != 0) && (fVar49 = fVar42, iVar34 != 1)) {
                  fVar49 = fVar46;
                }
                in_ZMM8 = ZEXT1664(auVar45);
                if ((iVar16 != 0) && (in_ZMM8 = ZEXT1664(auVar43), iVar16 != 1)) {
                  in_ZMM8 = ZEXT1664(auVar41);
                }
                auVar38 = auVar45;
                if ((iVar34 != 0) && (auVar38 = auVar43, iVar34 != 1)) {
                  auVar38 = auVar41;
                }
                pPVar18 = &nodeBounds->pMax;
                if ((iVar31 != 0) && (pPVar18 = (Point3<float> *)pfVar1, iVar31 != 1)) {
                  pPVar18 = (Point3<float> *)pfVar3;
                }
                fVar50 = fVar12;
                if ((iVar16 != 0) && (fVar50 = fVar42, iVar16 != 1)) {
                  fVar50 = fVar46;
                }
                fVar51 = fVar12;
                if ((iVar34 != 0) && (fVar51 = fVar42, iVar34 != 1)) {
                  fVar51 = fVar46;
                }
                auVar13 = vcvtsi2ss_avx512f(in_XMM20,iVar28);
                bVar36 = iVar19 == 0;
                auVar38 = vfmadd213ss_fma(auVar38,in_ZMM8._0_16_,
                                          ZEXT416((uint)((fVar50 + fVar51) *
                                                        ((pPVar18->super_Tuple3<pbrt::Point3,_float>
                                                         ).x - fVar40))));
                auVar39 = vfmadd213ss_fma(auVar39,auVar47,
                                          ZEXT416((uint)((fVar40 - (pBVar33->pMin).
                                                                   super_Tuple3<pbrt::Point3,_float>
                                                                   .x) * (fVar48 + fVar49))));
                auVar47 = vcvtsi2ss_avx512f(in_XMM20,iVar19);
                auVar52 = ZEXT416((uint)(1.0 / (auVar14._0_4_ + auVar14._0_4_)));
                auVar38 = vmulss_avx512f(auVar52,ZEXT416((uint)(auVar38._0_4_ + auVar38._0_4_)));
                auVar39 = vmulss_avx512f(auVar52,ZEXT416((uint)(auVar39._0_4_ + auVar39._0_4_)));
                auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * auVar13._0_4_)),auVar39,
                                          auVar47);
                auVar39 = vfmadd213ss_fma(auVar47,ZEXT416((uint)((float)((uint)(iVar28 == 0) *
                                                                         auVar37._0_4_ +
                                                                        (uint)(iVar28 != 0) *
                                                                        ((uint)bVar36 *
                                                                         auVar37._0_4_ +
                                                                        (uint)!bVar36 * 0x3f800000))
                                                                * (float)this->isectCost)),auVar44);
                auVar47 = vucomiss_avx512f(auVar39);
                vminss_avx512f(auVar39,auVar47);
                if (!bVar36) {
                  local_140 = uVar27;
                }
                local_140 = local_140 & 0xffffffff;
                if (!bVar36) {
                  uVar22 = uVar25;
                }
              }
            }
            uVar26 = (uint)uVar22;
            iVar19 = iVar19 + (uint)(*pEVar23 == Start);
            uVar27 = uVar27 + 1;
            pEVar23 = pEVar23 + 3;
          } while (uVar24 != uVar27);
          bVar36 = iVar28 == 0;
        }
      }
      if ((iVar19 != nPrimitives) || (!bVar36)) {
        LogFatal<char_const(&)[37]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp"
                   ,0x3b4,"Check failed: %s",(char (*) [37])"nBelow == nPrimitives && nAbove == 0");
      }
      bVar36 = 1 < iVar20;
      if (bVar36 || uVar26 != 0xffffffff) {
        vucomiss_avx512f(ZEXT416((uint)fVar11));
        vucomiss_avx512f(ZEXT416((uint)(fVar11 * 4.0)));
        if ((uVar26 == 0xffffffff) || (badRefines == 3)) {
          pKVar17 = this->nodes;
          goto LAB_0042a32d;
        }
        iVar31 = 0;
        iVar28 = 0;
        iVar19 = (int)local_140;
        if (0 < iVar19) {
          lVar29 = 0;
          iVar31 = 0;
          pBVar35 = edges[(int)uVar26]._M_t.
                    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                    .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
          do {
            if (*(int *)((long)&pBVar35->type + lVar29) == 0) {
              lVar30 = (long)iVar31;
              iVar31 = iVar31 + 1;
              prims0[lVar30] = *(int *)((long)&pBVar35->primNum + lVar29);
            }
            lVar29 = lVar29 + 0xc;
          } while (local_140 * 0xc != lVar29);
        }
        pBVar35 = edges[(int)uVar26]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        if (iVar19 + 1 < (int)uVar15) {
          iVar28 = 0;
          pEVar23 = &pBVar35[iVar19 + 1].type;
          iVar16 = nPrimitives * -2 + 1 + iVar19;
          do {
            if (*pEVar23 == End) {
              lVar29 = (long)iVar28;
              iVar28 = iVar28 + 1;
              prims1[lVar29] = pEVar23[-1];
            }
            pEVar23 = pEVar23 + 3;
            iVar16 = iVar16 + 1;
          } while (iVar16 != 0);
        }
        fVar40 = pBVar35[iVar19].t;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        if (uVar26 == 1) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar40;
          pPVar18 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        }
        else if (uVar26 == 0) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar40;
          pPVar18 = &bounds0.pMax;
        }
        else {
          pPVar18 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar40;
        }
        (pPVar18->super_Tuple3<pbrt::Point3,_float>).x = fVar40;
        buildTree(this,nodeNum + 1,&bounds0,allPrimBounds,prims0,iVar31,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
        iVar31 = this->nextFreeNode;
        pKVar17 = this->nodes;
        pKVar17[nodeNum].field_0.onePrimitive = (int)fVar40;
        pKVar17[nodeNum].field_1.flags = iVar31 * 4 | uVar26;
        buildTree(this,iVar31,&bounds1,allPrimBounds,prims1,iVar28,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
      }
      else {
        iVar20 = iVar20 + 1;
        uVar25 = (ulong)((iVar31 + 1U) % 3);
      }
      if (bVar36 || uVar26 != 0xffffffff) {
        return;
      }
    } while( true );
  }
  pKVar17 = this->nodes;
LAB_0042a32d:
  KdAccelNode::InitLeaf(pKVar17 + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
  return;
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds, int *primNums,
                                int nPrimitives, int depth,
                                const std::unique_ptr<BoundEdge[]> edges[3], int *prims0,
                                int *prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdAccelNode *n = new KdAccelNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            memcpy(n, nodes, nAllocedNodes * sizeof(KdAccelNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (nPrimitives <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity;
    Float oldCost = isectCost * Float(nPrimitives);
    Float totalSA = nodeBounds.SurfaceArea();
    Float invTotalSA = 1 / totalSA;
    Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    int retries = 0;
retrySplit:
    // Initialize edges for _axis_
    for (int i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(&edges[axis][0], &edges[axis][2 * nPrimitives],
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  if (e0.t == e1.t)
                      return (int)e0.type < (int)e1.type;
                  else
                      return e0.t < e1.t;
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = nPrimitives;
    for (int i = 0; i < 2 * nPrimitives; ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute cost for split at _i_th edge
            // Compute child surface areas for split at _edgeT_
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            Float pBelow = belowSA * invTotalSA;
            Float pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Create leaf if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }
    if (bestCost > oldCost)
        ++badRefines;
    if ((bestCost > 4 * oldCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize children nodes
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0, n0, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1, n1, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
}